

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O1

boolean water_prayer(boolean bless_water)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  boolean bVar4;
  obj *poVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    uVar6 = 0;
    if ((ublindf == (obj *)0x0) || (uVar6 = 0, ublindf->oartifact != '\x1d')) goto LAB_00225838;
  }
  uVar6 = 0x40;
  if ((u.uprops[0x23].intrinsic != 0) &&
     ((u.uprops[0x24].extrinsic == 0 && (uVar6 = 0, u.umonnum != u.umonster)))) {
    bVar4 = dmgtype(youmonst.data,0x24);
    uVar6 = (uint)(bVar4 != '\0') << 6;
  }
LAB_00225838:
  poVar5 = level->objects[u.ux][u.uy];
  if (poVar5 == (obj *)0x0) {
    lVar8 = 0;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    lVar8 = 0;
    do {
      if (poVar5->otyp == 0x14f) {
        if (bless_water == '\0') {
          uVar1 = *(uint *)&poVar5->field_0x4a & 1;
        }
        else {
          uVar1 = *(uint *)&poVar5->field_0x4a & 2;
        }
        if (uVar1 != 0) goto LAB_002258ad;
        *(uint *)&poVar5->field_0x4a =
             *(uint *)&poVar5->field_0x4a & 0xffffffbc |
             uVar6 | (bless_water * '\x02' & 2U | bless_water == '\0');
        lVar8 = lVar8 + poVar5->quan;
      }
      else {
LAB_002258ad:
        if (poVar5->oclass == '\b') {
          bVar3 = true;
        }
      }
      poVar5 = (poVar5->v).v_nexthere;
    } while (poVar5 != (obj *)0x0);
  }
  if ((((u.uprops[0x1e].intrinsic == 0) &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && (lVar8 != 0)) {
    pcVar7 = "One of the";
    if (1 < lVar8) {
      pcVar7 = "Some of the";
    }
    pcVar9 = "";
    pcVar10 = "";
    if (lVar8 < 2) {
      pcVar9 = "s";
    }
    else {
      pcVar10 = "s";
    }
    pcVar2 = "The";
    if (bVar3) {
      pcVar10 = "s";
      pcVar2 = pcVar7;
    }
    pcVar7 = "light blue";
    if (bless_water == '\0') {
      pcVar7 = "black";
    }
    pcVar7 = hcolor(pcVar7);
    pline("%s potion%s on the altar glow%s %s for a moment.",pcVar2,pcVar10,pcVar9,pcVar7);
  }
  return 0 < lVar8;
}

Assistant:

static boolean water_prayer(boolean bless_water)
{
    struct obj* otmp;
    long changed = 0;
    boolean other = FALSE, bc_known = !(Blind || Hallucination);

    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
	/* turn water into (un)holy water */
	if (otmp->otyp == POT_WATER &&
		(bless_water ? !otmp->blessed : !otmp->cursed)) {
	    otmp->blessed = bless_water;
	    otmp->cursed = !bless_water;
	    otmp->bknown = bc_known;
	    changed += otmp->quan;
	} else if (otmp->oclass == POTION_CLASS)
	    other = TRUE;
    }
    if (!Blind && changed) {
	pline("%s potion%s on the altar glow%s %s for a moment.",
	      ((other && changed > 1L) ? "Some of the" :
					(other ? "One of the" : "The")),
	      ((other || changed > 1L) ? "s" : ""), (changed > 1L ? "" : "s"),
	      (bless_water ? hcolor("light blue") : hcolor("black")));
    }
    return (boolean)(changed > 0L);
}